

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::CaptureDynamicProfileState
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  NativeEntryPointData *pNVar1;
  
  pNVar1 = EntryPointInfo::GetNativeEntryPointData(&entryPointInfo->super_EntryPointInfo);
  this->savedPolymorphicCacheState = pNVar1->pendingPolymorphicCacheState;
  pNVar1 = EntryPointInfo::GetNativeEntryPointData(&entryPointInfo->super_EntryPointInfo);
  this->savedInlinerVersion = pNVar1->pendingInlinerVersion;
  pNVar1 = EntryPointInfo::GetNativeEntryPointData(&entryPointInfo->super_EntryPointInfo);
  this->savedImplicitCallsFlags = pNVar1->pendingImplicitCallFlags;
  return;
}

Assistant:

void FunctionBody::CaptureDynamicProfileState(FunctionEntryPointInfo* entryPointInfo)
    {
        // DisableJIT-TODO: Move this to be under if DYNAMIC_PROFILE
#if ENABLE_NATIVE_CODEGEN
        // (See also the FunctionBody member written in CaptureDynamicProfileState.)
        this->SetSavedPolymorphicCacheState(entryPointInfo->GetNativeEntryPointData()->GetPendingPolymorphicCacheState());
        this->savedInlinerVersion = entryPointInfo->GetNativeEntryPointData()->GetPendingInlinerVersion();
        this->savedImplicitCallsFlags = entryPointInfo->GetNativeEntryPointData()->GetPendingImplicitCallFlags();
#endif
    }